

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptorProto::~ServiceDescriptorProto(ServiceDescriptorProto *this)

{
  ~ServiceDescriptorProto(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

ServiceDescriptorProto::~ServiceDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.ServiceDescriptorProto)
  SharedDtor(*this);
}